

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::Operation<double,double,duckdb::QuantileDirect<double>>
          (Interpolator<false> *this,double *v_t,Vector *result,QuantileDirect<double> *accessor)

{
  double dVar1;
  idx_t iVar2;
  long lVar3;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<double>_>_> __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<double>_>_> __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<double>_>_> __comp_01;
  double dVar4;
  bool bVar5;
  ulong uVar6;
  idx_t iVar7;
  InvalidInputException *pIVar8;
  idx_t iVar9;
  duckdb *pdVar10;
  idx_t iVar11;
  double result_1;
  string local_50;
  double local_30;
  double local_28;
  
  bVar5 = this->desc;
  iVar9 = this->CRN;
  iVar11 = this->FRN;
  iVar2 = this->begin;
  iVar7 = this->end;
  local_50._M_dataplus._M_p = (pointer)accessor;
  local_50._M_string_length = (size_type)accessor;
  local_50.field_2._M_local_buf[0] = bVar5;
  if (iVar9 == iVar11) {
    if (iVar9 != iVar7 && iVar2 != iVar7) {
      uVar6 = (long)(iVar7 * 8 + iVar2 * -8) >> 3;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar5;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      std::
      __introselect<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<double>>>>
                (v_t + iVar2,v_t + iVar9,v_t + iVar7,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar9 = this->FRN;
    }
    dVar1 = v_t[iVar9];
    pdVar10 = (duckdb *)0x0;
    bVar5 = duckdb::TryCast::Operation<double,double>(dVar1,&local_30,false);
    if (!bVar5) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_50,pdVar10,dVar1);
      duckdb::InvalidInputException::InvalidInputException(pIVar8,(string *)&local_50);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar11 != iVar7 && iVar2 != iVar7) {
      uVar6 = (long)(iVar7 * 8 + iVar2 * -8) >> 3;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar5;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      std::
      __introselect<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<double>>>>
                (v_t + iVar2,v_t + iVar11,v_t + iVar7,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar11 = this->FRN;
      iVar9 = this->CRN;
      iVar7 = this->end;
    }
    local_50._M_dataplus._M_p = (pointer)accessor;
    local_50._M_string_length = (size_type)accessor;
    local_50.field_2._M_local_buf[0] = bVar5;
    if (iVar9 != iVar7 && iVar11 != iVar7) {
      uVar6 = (long)(iVar7 * 8 + iVar11 * -8) >> 3;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar5;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      std::
      __introselect<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<double>>>>
                (v_t + iVar11,v_t + iVar9,v_t + iVar7,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar11 = this->FRN;
    }
    dVar1 = v_t[iVar11];
    pdVar10 = (duckdb *)0x0;
    bVar5 = duckdb::TryCast::Operation<double,double>(dVar1,&local_30,false);
    dVar4 = local_30;
    if (!bVar5) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_50,pdVar10,dVar1);
      duckdb::InvalidInputException::InvalidInputException(pIVar8,(string *)&local_50);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_28 = v_t[this->CRN];
    pdVar10 = (duckdb *)0x0;
    bVar5 = duckdb::TryCast::Operation<double,double>(local_28,&local_30,false);
    if (!bVar5) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      CastExceptionText<double,double>(&local_50,pdVar10,local_28);
      duckdb::InvalidInputException::InvalidInputException(pIVar8,(string *)&local_50);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar1 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_30 = dVar1 * local_30 + dVar4 * (1.0 - dVar1);
  }
  return local_30;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}